

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::MultiAggregationPS::MultiAggregationPS
          (MultiAggregationPS *this,MultiAggregationPS *old)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__MultiAggregationPS_0053ed98;
  iVar2 = old->m_i;
  iVar3 = old->m_old_j;
  iVar4 = old->m_old_i;
  this->m_j = old->m_j;
  this->m_i = iVar2;
  this->m_old_j = iVar3;
  this->m_old_i = iVar4;
  dVar1 = old->m_lower;
  this->m_upper = old->m_upper;
  this->m_lower = dVar1;
  dVar1 = old->m_const;
  this->m_obj = old->m_obj;
  this->m_const = dVar1;
  this->m_onLhs = old->m_onLhs;
  this->m_eqCons = old->m_eqCons;
  DSVectorBase<double>::DSVectorBase(&this->m_row,&old->m_row);
  DSVectorBase<double>::DSVectorBase(&this->m_col,&old->m_col);
  return;
}

Assistant:

MultiAggregationPS(const MultiAggregationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_upper(old.m_upper)
         , m_lower(old.m_lower)
         , m_obj(old.m_obj)
         , m_const(old.m_const)
         , m_onLhs(old.m_onLhs)
         , m_eqCons(old.m_eqCons)
         , m_row(old.m_row)
         , m_col(old.m_col)
      {}